

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codebinexpval(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int line)

{
  OpCode op_00;
  int v2_00;
  TMS event;
  int v2;
  OpCode op;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr opr_local;
  FuncState *fs_local;
  
  op_00 = binopr2op(opr,OPR_ADD,OP_ADD);
  v2_00 = luaK_exp2anyreg(fs,e2);
  event = binopr2TM(opr);
  finishbinexpval(fs,e1,e2,op_00,v2_00,0,line,OP_MMBIN,event);
  return;
}

Assistant:

static void codebinexpval (FuncState *fs, BinOpr opr,
                           expdesc *e1, expdesc *e2, int line) {
  OpCode op = binopr2op(opr, OPR_ADD, OP_ADD);
  int v2 = luaK_exp2anyreg(fs, e2);  /* make sure 'e2' is in a register */
  /* 'e1' must be already in a register or it is a constant */
  lua_assert((VNIL <= e1->k && e1->k <= VKSTR) ||
             e1->k == VNONRELOC || e1->k == VRELOC);
  lua_assert(OP_ADD <= op && op <= OP_SHR);
  finishbinexpval(fs, e1, e2, op, v2, 0, line, OP_MMBIN, binopr2TM(opr));
}